

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::SectionTracking::TestCaseTracker::enterSection(TestCaseTracker *this,string *name)

{
  RunState RVar1;
  bool bVar2;
  TrackedSection *pTVar3;
  
  pTVar3 = TrackedSection::acquireChild(this->m_currentSection,name);
  if ((this->m_completedASectionThisRun == false) &&
     (RVar1 = pTVar3->m_runState, RVar1 != Completed)) {
    this->m_currentSection = pTVar3;
    bVar2 = true;
    if (RVar1 == NotStarted) {
      pTVar3->m_runState = Executing;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool enterSection( std::string const& name ) {
            TrackedSection* child = m_currentSection->acquireChild( name );
            if( m_completedASectionThisRun || child->runState() == TrackedSection::Completed )
                return false;

            m_currentSection = child;
            m_currentSection->enter();
            return true;
        }